

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,ZoneInfoSource *zip)

{
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  *this_00;
  vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  *this_01;
  uint_fast8_t *puVar1;
  int_least64_t *piVar2;
  byte bVar3;
  uint_fast8_t tt1_index;
  uint_least8_t uVar4;
  pointer pTVar5;
  const_iterator cVar6;
  pointer pTVar7;
  byte bVar8;
  char acVar9 [1];
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar12;
  undefined4 extraout_var_01;
  ulong uVar13;
  uint_least8_t *puVar14;
  int_fast32_t iVar15;
  iterator iVar16;
  long lVar17;
  bool *pbVar18;
  TransitionType *tt;
  size_type sVar19;
  ZoneInfoSource *azip;
  pointer cp;
  ZoneInfoSource *pZVar20;
  size_t sVar21;
  size_t i;
  size_t sVar22;
  long lVar23;
  pointer pTVar24;
  civil_time<absl::time_internal::cctz::detail::second_tag> cVar25;
  size_t sStack_100;
  Header local_c8;
  absolute_lookup local_98;
  vector<char,_std::allocator<char>_> tbuf;
  tzhead tzh;
  
  iVar11 = (*zip->_vptr_ZoneInfoSource[2])(zip,&tzh,0x2c);
  if (CONCAT44(extraout_var,iVar11) != 0x2c) {
    return false;
  }
  if (tzh.tzh_magic != (char  [4])0x66695a54) {
    return false;
  }
  bVar10 = Header::Build(&local_c8,&tzh);
  acVar9[0] = tzh.tzh_version[0];
  if (!bVar10) {
    return false;
  }
  if (tzh.tzh_version[0] == '\0') {
    sStack_100 = 4;
  }
  else {
    iVar11 = (*zip->_vptr_ZoneInfoSource[3])
                       (zip,local_c8.typecnt * 6 + local_c8.timecnt * 5 + local_c8.charcnt +
                            local_c8.leapcnt * 8 + local_c8.ttisstdcnt + local_c8.ttisutcnt);
    if (iVar11 != 0) {
      return false;
    }
    iVar11 = (*zip->_vptr_ZoneInfoSource[2])(zip,&tzh,0x2c);
    if (CONCAT44(extraout_var_00,iVar11) != 0x2c) {
      return false;
    }
    if (tzh.tzh_magic != (char  [4])0x66695a54) {
      return false;
    }
    if (tzh.tzh_version[0] == '\0') {
      return false;
    }
    bVar10 = Header::Build(&local_c8,&tzh);
    if (!bVar10) {
      return false;
    }
    sStack_100 = 8;
  }
  if ((((local_c8.typecnt == 0) || (local_c8.leapcnt != 0)) ||
      (local_c8.ttisstdcnt != 0 && local_c8.ttisstdcnt != local_c8.typecnt)) ||
     (local_c8.ttisutcnt != 0 && local_c8.ttisutcnt != local_c8.typecnt)) {
    return false;
  }
  sVar12 = Header::DataLength(&local_c8,sStack_100);
  std::vector<char,_std::allocator<char>_>::vector(&tbuf,sVar12,(allocator_type *)&local_98);
  iVar11 = (*zip->_vptr_ZoneInfoSource[2])
                     (zip,tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar12);
  sVar22 = local_c8.timecnt;
  if (CONCAT44(extraout_var_01,iVar11) == sVar12) {
    this_00 = &this->transitions_;
    std::
    vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ::reserve(this_00,local_c8.timecnt + 2);
    std::
    vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ::resize(this_00,sVar22);
    pTVar5 = (this_00->
             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
             )._M_impl.super__Vector_impl_data._M_start;
    cp = tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    for (sVar19 = 0; sVar19 != sVar22; sVar19 = sVar19 + 1) {
      if (acVar9[0] == '\0') {
        uVar13 = anon_unknown_0::Decode32(cp);
      }
      else {
        uVar13 = 0;
        for (lVar17 = 0; (int)lVar17 != 8; lVar17 = lVar17 + 1) {
          uVar13 = uVar13 << 8 | (ulong)(byte)cp[lVar17];
        }
      }
      pTVar5[sVar19].unix_time = uVar13;
      cp = cp + sStack_100;
      if ((sVar19 != 0) && ((long)uVar13 <= pTVar5[sVar19 - 1].unix_time)) {
        if (sVar19 != sVar22) goto LAB_0014eb72;
        break;
      }
    }
    puVar14 = &((this_00->
                super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                )._M_impl.super__Vector_impl_data._M_start)->type_index;
    bVar8 = 0;
    for (sVar19 = 0; sVar22 != sVar19; sVar19 = sVar19 + 1) {
      bVar3 = cp[sVar19];
      *puVar14 = bVar3;
      if (local_c8.typecnt <= bVar3) goto LAB_0014eb72;
      bVar8 = bVar8 | bVar3 == 0;
      puVar14 = puVar14 + 0x30;
    }
    this_01 = &this->transition_types_;
    std::
    vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
    ::reserve(this_01,local_c8.typecnt + 2);
    std::
    vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
    ::resize(this_01,local_c8.typecnt);
    sVar12 = local_c8.charcnt;
    pZVar20 = (ZoneInfoSource *)(cp + sVar19);
    pTVar24 = (this_01->
              super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar14 = &pTVar24->abbr_index;
    sVar21 = local_c8.typecnt;
    while (bVar10 = sVar21 != 0, sVar21 = sVar21 - 1, bVar10) {
      iVar15 = anon_unknown_0::Decode32((char *)pZVar20);
      ((TransitionType *)(puVar14 + -0x29))->utc_offset = (int)iVar15;
      if ((int)iVar15 - 0x15180U < 0xfffd5d01) goto LAB_0014eb72;
      puVar14[-1] = *(char *)((long)&pZVar20->_vptr_ZoneInfoSource + 4) != '\0';
      bVar3 = *(byte *)((long)&pZVar20->_vptr_ZoneInfoSource + 5);
      *puVar14 = bVar3;
      if (sVar12 <= bVar3) goto LAB_0014eb72;
      pZVar20 = (ZoneInfoSource *)((long)&pZVar20->_vptr_ZoneInfoSource + 6);
      puVar14 = puVar14 + 0x30;
    }
    this->default_transition_type_ = '\0';
    if (!(bool)(~bVar8 & 1) && sVar22 != 0) {
      if (pTVar24->is_dst == true) {
        uVar13 = (ulong)((this_00->
                         super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                         )._M_impl.super__Vector_impl_data._M_start)->type_index;
        pbVar18 = &pTVar24[uVar13].is_dst;
        while (uVar13 != 0) {
          if (*pbVar18 != true) goto LAB_0014e908;
          pbVar18 = pbVar18 + -0x30;
          uVar13 = uVar13 - 1;
        }
      }
      uVar13 = 0;
LAB_0014e908:
      do {
        if (local_c8.typecnt == (uVar13 & 0xff)) break;
        if (pTVar24[uVar13 & 0xff].is_dst != true) {
          this->default_transition_type_ = (uint_fast8_t)uVar13;
          break;
        }
        uVar13 = (ulong)(byte)((uint_fast8_t)uVar13 + 1);
      } while( true );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&this->abbreviations_,sVar12 + 10);
    azip = pZVar20;
    std::__cxx11::string::assign((char *)&this->abbreviations_,(ulong)pZVar20);
    if ((pointer)((long)pZVar20 +
                 local_c8.leapcnt * 0xc +
                 local_c8.charcnt + local_c8.ttisstdcnt + local_c8.ttisutcnt) !=
        tbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      __assert_fail("bp == tbuf.data() + tbuf.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/time/internal/cctz/src/time_zone_info.cc"
                    ,0x1e7,"bool absl::time_internal::cctz::TimeZoneInfo::Load(ZoneInfoSource *)");
    }
    (this->future_spec_)._M_string_length = 0;
    *(this->future_spec_)._M_dataplus._M_p = '\0';
    if (tzh.tzh_version[0] == '\0') {
LAB_0014e9cb:
      if ((this->version_)._M_string_length == 0) {
        (*zip->_vptr_ZoneInfoSource[4])(&local_98,zip);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&this->version_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      puVar14 = &(this_00->
                 super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                 )._M_impl.super__Vector_impl_data._M_start[local_c8.timecnt - 1].type_index;
      sVar22 = local_c8.timecnt;
      do {
        uVar13 = (ulong)(local_c8.timecnt != 0);
        if (sVar22 < 2) break;
        tt1_index = *puVar14;
        puVar1 = puVar14 + -0x30;
        puVar14 = puVar14 + -0x30;
        bVar10 = EquivTransitions(this,tt1_index,*puVar1);
        uVar13 = sVar22;
        sVar22 = sVar22 - 1;
      } while (bVar10);
      std::
      vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
      ::resize(this_00,uVar13);
      cVar6._M_current =
           (this->transitions_).
           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if ((cVar6._M_current ==
           (this->transitions_).
           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish) || (-1 < (cVar6._M_current)->unix_time)) {
        iVar16 = std::
                 vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                 ::_M_emplace_aux<>(this_00,cVar6);
        (iVar16._M_current)->unix_time = -0x800000000000000;
        (iVar16._M_current)->type_index = this->default_transition_type_;
      }
      bVar10 = ExtendTransitions(this);
      if (bVar10) {
        cVar6._M_current =
             (this->transitions_).
             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (cVar6._M_current[-1].unix_time < 0) {
          uVar4 = cVar6._M_current[-1].type_index;
          iVar16 = std::
                   vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                   ::_M_emplace_aux<>(this_00,cVar6);
          (iVar16._M_current)->unix_time = 0x7fffffff;
          (iVar16._M_current)->type_index = uVar4;
        }
        tt = (this->transition_types_).
             super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ._M_impl.super__Vector_impl_data._M_start + this->default_transition_type_;
        lVar17 = 0x10;
        for (lVar23 = 0;
            pTVar5 = (this->transitions_).
                     super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            lVar23 != ((long)(this->transitions_).
                             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x30;
            lVar23 = lVar23 + 1) {
          LocalTime(&local_98,this,*(int_fast64_t *)((long)pTVar5 + lVar17 + -0x10),tt);
          cVar25.f_.m = '\x01';
          cVar25.f_.d = '\0';
          cVar25.f_.hh = '\0';
          cVar25.f_.mm = '\0';
          cVar25.f_.ss = '\0';
          cVar25.f_._13_3_ = 0;
          cVar25.f_.y._0_1_ = local_98.cs.f_.m;
          cVar25.f_.y._1_1_ = local_98.cs.f_.d;
          cVar25.f_.y._2_1_ = local_98.cs.f_.hh;
          cVar25.f_.y._3_1_ = local_98.cs.f_.mm;
          cVar25.f_.y._4_1_ = local_98.cs.f_.ss;
          cVar25.f_.y._5_3_ = local_98.cs.f_._13_3_;
          cVar25 = detail::operator-((detail *)local_98.cs.f_.y,cVar25,(diff_t)tt);
          *(int_least64_t *)((long)&(pTVar5->civil_sec).f_.y + lVar17) = cVar25.f_.y;
          *(long *)(&(pTVar5->civil_sec).f_.m + lVar17) = cVar25.f_._8_8_;
          tt = (this->transition_types_).
               super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start + *(byte *)((long)pTVar5 + lVar17 + -8);
          LocalTime(&local_98,this,*(int_fast64_t *)((long)pTVar5 + lVar17 + -0x10),tt);
          piVar2 = (int_least64_t *)((long)&pTVar5->unix_time + lVar17);
          *piVar2 = local_98.cs.f_.y;
          piVar2[1] = local_98.cs.f_._8_8_;
          if ((lVar23 != 0) &&
             (bVar10 = detail::operator<((civil_time<absl::time_internal::cctz::detail::second_tag>
                                          *)((long)&(this_00->
                                                                                                        
                                                  super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[-1].
                                                  unix_time + lVar17),
                                         (civil_time<absl::time_internal::cctz::detail::second_tag>
                                          *)((long)&pTVar5->unix_time + lVar17)), !bVar10))
          goto LAB_0014eb72;
          lVar17 = lVar17 + 0x30;
        }
        pTVar7 = (this->transition_types_).
                 super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pTVar24 = (this->transition_types_).
                       super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar24 != pTVar7;
            pTVar24 = pTVar24 + 1) {
          LocalTime(&local_98,this,0x7fffffffffffffff,pTVar24);
          (pTVar24->civil_max).f_.y = local_98.cs.f_.y;
          (pTVar24->civil_max).f_.m = local_98.cs.f_.m;
          (pTVar24->civil_max).f_.d = local_98.cs.f_.d;
          (pTVar24->civil_max).f_.hh = local_98.cs.f_.hh;
          (pTVar24->civil_max).f_.mm = local_98.cs.f_.mm;
          (pTVar24->civil_max).f_.ss = local_98.cs.f_.ss;
          *(undefined3 *)&(pTVar24->civil_max).f_.field_0xd = local_98.cs.f_._13_3_;
          LocalTime(&local_98,this,-0x8000000000000000,pTVar24);
          (pTVar24->civil_min).f_.y = local_98.cs.f_.y;
          (pTVar24->civil_min).f_.m = local_98.cs.f_.m;
          (pTVar24->civil_min).f_.d = local_98.cs.f_.d;
          (pTVar24->civil_min).f_.hh = local_98.cs.f_.hh;
          (pTVar24->civil_min).f_.mm = local_98.cs.f_.mm;
          (pTVar24->civil_min).f_.ss = local_98.cs.f_.ss;
          *(undefined3 *)&(pTVar24->civil_min).f_.field_0xd = local_98.cs.f_._13_3_;
        }
        std::
        vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
        ::_M_shrink_to_fit(this_00);
        bVar10 = true;
        goto LAB_0014eb74;
      }
    }
    else {
      iVar11 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,azip);
      if (iVar11 == 10) {
        iVar11 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,azip);
        while (iVar11 != -1) {
          if (iVar11 == 10) goto LAB_0014e9cb;
          pZVar20 = (ZoneInfoSource *)(ulong)(uint)(int)(char)iVar11;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->future_spec_,(char)iVar11);
          iVar11 = Load::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)zip,pZVar20)
          ;
        }
      }
    }
  }
LAB_0014eb72:
  bVar10 = false;
LAB_0014eb74:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tbuf.super__Vector_base<char,_std::allocator<char>_>);
  return bVar10;
}

Assistant:

bool TimeZoneInfo::Load(ZoneInfoSource* zip) {
  // Read and validate the header.
  tzhead tzh;
  if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
  if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
    return false;
  Header hdr;
  if (!hdr.Build(tzh)) return false;
  std::size_t time_len = 4;
  if (tzh.tzh_version[0] != '\0') {
    // Skip the 4-byte data.
    if (zip->Skip(hdr.DataLength(time_len)) != 0) return false;
    // Read and validate the header for the 8-byte data.
    if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
    if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
      return false;
    if (tzh.tzh_version[0] == '\0') return false;
    if (!hdr.Build(tzh)) return false;
    time_len = 8;
  }
  if (hdr.typecnt == 0) return false;
  if (hdr.leapcnt != 0) {
    // This code assumes 60-second minutes so we do not want
    // the leap-second encoded zoneinfo. We could reverse the
    // compensation, but the "right" encoding is rarely used
    // so currently we simply reject such data.
    return false;
  }
  if (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt) return false;
  if (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt) return false;

  // Read the data into a local buffer.
  std::size_t len = hdr.DataLength(time_len);
  std::vector<char> tbuf(len);
  if (zip->Read(tbuf.data(), len) != len) return false;
  const char* bp = tbuf.data();

  // Decode and validate the transitions.
  transitions_.reserve(hdr.timecnt + 2);
  transitions_.resize(hdr.timecnt);
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].unix_time = (time_len == 4) ? Decode32(bp) : Decode64(bp);
    bp += time_len;
    if (i != 0) {
      // Check that the transitions are ordered by time (as zic guarantees).
      if (!Transition::ByUnixTime()(transitions_[i - 1], transitions_[i]))
        return false;  // out of order
    }
  }
  bool seen_type_0 = false;
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].type_index = Decode8(bp++);
    if (transitions_[i].type_index >= hdr.typecnt) return false;
    if (transitions_[i].type_index == 0) seen_type_0 = true;
  }

  // Decode and validate the transition types.
  transition_types_.reserve(hdr.typecnt + 2);
  transition_types_.resize(hdr.typecnt);
  for (std::size_t i = 0; i != hdr.typecnt; ++i) {
    transition_types_[i].utc_offset =
        static_cast<std::int_least32_t>(Decode32(bp));
    if (transition_types_[i].utc_offset >= kSecsPerDay ||
        transition_types_[i].utc_offset <= -kSecsPerDay)
      return false;
    bp += 4;
    transition_types_[i].is_dst = (Decode8(bp++) != 0);
    transition_types_[i].abbr_index = Decode8(bp++);
    if (transition_types_[i].abbr_index >= hdr.charcnt) return false;
  }

  // Determine the before-first-transition type.
  default_transition_type_ = 0;
  if (seen_type_0 && hdr.timecnt != 0) {
    std::uint_fast8_t index = 0;
    if (transition_types_[0].is_dst) {
      index = transitions_[0].type_index;
      while (index != 0 && transition_types_[index].is_dst) --index;
    }
    while (index != hdr.typecnt && transition_types_[index].is_dst) ++index;
    if (index != hdr.typecnt) default_transition_type_ = index;
  }

  // Copy all the abbreviations.
  abbreviations_.reserve(hdr.charcnt + 10);
  abbreviations_.assign(bp, hdr.charcnt);
  bp += hdr.charcnt;

  // Skip the unused portions. We've already dispensed with leap-second
  // encoded zoneinfo. The ttisstd/ttisgmt indicators only apply when
  // interpreting a POSIX spec that does not include start/end rules, and
  // that isn't the case here (see "zic -p").
  bp += (8 + 4) * hdr.leapcnt;  // leap-time + TAI-UTC
  bp += 1 * hdr.ttisstdcnt;     // UTC/local indicators
  bp += 1 * hdr.ttisutcnt;      // standard/wall indicators
  assert(bp == tbuf.data() + tbuf.size());

  future_spec_.clear();
  if (tzh.tzh_version[0] != '\0') {
    // Snarf up the NL-enclosed future POSIX spec. Note
    // that version '3' files utilize an extended format.
    auto get_char = [](ZoneInfoSource* azip) -> int {
      unsigned char ch;  // all non-EOF results are positive
      return (azip->Read(&ch, 1) == 1) ? ch : EOF;
    };
    if (get_char(zip) != '\n') return false;
    for (int c = get_char(zip); c != '\n'; c = get_char(zip)) {
      if (c == EOF) return false;
      future_spec_.push_back(static_cast<char>(c));
    }
  }

  // We don't check for EOF so that we're forwards compatible.

  // If we did not find version information during the standard loading
  // process (as of tzh_version '3' that is unsupported), then ask the
  // ZoneInfoSource for any out-of-bound version string it may be privy to.
  if (version_.empty()) {
    version_ = zip->Version();
  }

  // Trim redundant transitions. zic may have added these to work around
  // differences between the glibc and reference implementations (see
  // zic.c:dontmerge) and the Qt library (see zic.c:WORK_AROUND_QTBUG_53071).
  // For us, they just get in the way when we do future_spec_ extension.
  while (hdr.timecnt > 1) {
    if (!EquivTransitions(transitions_[hdr.timecnt - 1].type_index,
                          transitions_[hdr.timecnt - 2].type_index)) {
      break;
    }
    hdr.timecnt -= 1;
  }
  transitions_.resize(hdr.timecnt);

  // Ensure that there is always a transition in the first half of the
  // time line (the second half is handled below) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  if (transitions_.empty() || transitions_.front().unix_time >= 0) {
    Transition& tr(*transitions_.emplace(transitions_.begin()));
    tr.unix_time = -(1LL << 59);  // -18267312070-10-26T17:01:52+00:00
    tr.type_index = default_transition_type_;
  }

  // Extend the transitions using the future specification.
  if (!ExtendTransitions()) return false;

  // Ensure that there is always a transition in the second half of the
  // time line (the first half is handled above) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  const Transition& last(transitions_.back());
  if (last.unix_time < 0) {
    const std::uint_fast8_t type_index = last.type_index;
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = 2147483647;  // 2038-01-19T03:14:07+00:00
    tr.type_index = type_index;
  }

  // Compute the local civil time for each transition and the preceding
  // second. These will be used for reverse conversions in MakeTime().
  const TransitionType* ttp = &transition_types_[default_transition_type_];
  for (std::size_t i = 0; i != transitions_.size(); ++i) {
    Transition& tr(transitions_[i]);
    tr.prev_civil_sec = LocalTime(tr.unix_time, *ttp).cs - 1;
    ttp = &transition_types_[tr.type_index];
    tr.civil_sec = LocalTime(tr.unix_time, *ttp).cs;
    if (i != 0) {
      // Check that the transitions are ordered by civil time. Essentially
      // this means that an offset change cannot cross another such change.
      // No one does this in practice, and we depend on it in MakeTime().
      if (!Transition::ByCivilTime()(transitions_[i - 1], tr))
        return false;  // out of order
    }
  }

  // Compute the maximum/minimum civil times that can be converted to a
  // time_point<seconds> for each of the zone's transition types.
  for (auto& tt : transition_types_) {
    tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
    tt.civil_min = LocalTime(seconds::min().count(), tt).cs;
  }

  transitions_.shrink_to_fit();
  return true;
}